

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateWindowParentAndRootLinks
               (ImGuiWindow *window,ImGuiWindowFlags flags,ImGuiWindow *parent_window)

{
  ImGuiWindow *pIVar1;
  
  window->ParentWindow = parent_window;
  window->RootWindowForNav = window;
  window->RootWindowForTitleBarHighlight = window;
  window->RootWindowDockStop = window;
  window->RootWindow = window;
  if ((((flags & 0x3000000U) == 0x1000000 && parent_window != (ImGuiWindow *)0x0) &&
      (window->RootWindow = parent_window->RootWindow, (window->field_0x482 & 1) == 0)) &&
     ((parent_window->Flags & 0x20000000) == 0)) {
    window->RootWindowDockStop = parent_window->RootWindowDockStop;
  }
  if (((parent_window != (ImGuiWindow *)0x0) && ((flags & 0x8000000U) == 0)) &&
     ((flags & 0x5000000U) != 0)) {
    window->RootWindowForTitleBarHighlight = parent_window->RootWindowForTitleBarHighlight;
  }
  pIVar1 = window->RootWindowForNav;
  while( true ) {
    if ((pIVar1->Flags & 0x800000) == 0) {
      return;
    }
    pIVar1 = pIVar1->ParentWindow;
    if (pIVar1 == (ImGuiWindow *)0x0) break;
    window->RootWindowForNav = pIVar1;
  }
  __assert_fail("window->RootWindowForNav->ParentWindow != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                ,0x16c5,
                "void ImGui::UpdateWindowParentAndRootLinks(ImGuiWindow *, ImGuiWindowFlags, ImGuiWindow *)"
               );
}

Assistant:

void ImGui::UpdateWindowParentAndRootLinks(ImGuiWindow* window, ImGuiWindowFlags flags, ImGuiWindow* parent_window)
{
    window->ParentWindow = parent_window;
    window->RootWindow = window->RootWindowDockStop = window->RootWindowForTitleBarHighlight = window->RootWindowForNav = window;
    if (parent_window && (flags & ImGuiWindowFlags_ChildWindow) && !(flags & ImGuiWindowFlags_Tooltip))
    {
        window->RootWindow = parent_window->RootWindow;
        if (!window->DockIsActive && !(parent_window->Flags & ImGuiWindowFlags_DockNodeHost))
            window->RootWindowDockStop = parent_window->RootWindowDockStop;
    }
    if (parent_window && !(flags & ImGuiWindowFlags_Modal) && (flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_Popup)))
        window->RootWindowForTitleBarHighlight = parent_window->RootWindowForTitleBarHighlight;
    while (window->RootWindowForNav->Flags & ImGuiWindowFlags_NavFlattened)
    {
        IM_ASSERT(window->RootWindowForNav->ParentWindow != NULL);
        window->RootWindowForNav = window->RootWindowForNav->ParentWindow;
    }
}